

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O0

void pzshape::TPZShapeTetra::ShapeOrder
               (TPZVec<long> *id,TPZVec<int> *order,TPZGenMatrix<int> *shapeorders)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  TPZVec<int> *in_RSI;
  int jc;
  int il;
  int ncol;
  int nlin;
  TPZGenMatrix<int> locshapeorders;
  int sideorder;
  int side;
  int linha;
  int nshape;
  int64_t nsides;
  TPZGenMatrix<int> *in_stack_00000108;
  int in_stack_00000114;
  TPZVec<long> *in_stack_00000118;
  int in_stack_00000124;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  TPZGenMatrix<int> *in_stack_ffffffffffffff70;
  TPZGenMatrix<int> *in_stack_ffffffffffffff78;
  int64_t in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  int local_64;
  int local_60;
  TPZGenMatrix<int> local_48;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  TPZVec<int> *local_10;
  
  local_20 = 0xf;
  local_28 = 0;
  local_10 = in_RSI;
  for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
    local_24 = 1;
    if (3 < local_2c) {
      TPZVec<int>::operator[](local_10,(long)local_2c + -4);
      local_24 = NConnectShapeF((int)in_stack_ffffffffffffff80,
                                (int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    }
    local_30 = 1;
    if (3 < local_2c) {
      piVar3 = TPZVec<int>::operator[](local_10,(long)local_2c + -4);
      local_30 = *piVar3;
    }
    TPZGenMatrix<int>::TPZGenMatrix(&local_48,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    SideShapeOrder(in_stack_00000124,in_stack_00000118,in_stack_00000114,in_stack_00000108);
    in_stack_ffffffffffffff88 = TPZGenMatrix<int>::Rows(&local_48);
    iVar1 = (int)in_stack_ffffffffffffff88;
    in_stack_ffffffffffffff80 = TPZGenMatrix<int>::Cols(&local_48);
    iVar2 = (int)in_stack_ffffffffffffff80;
    for (local_60 = 0; local_60 < iVar1; local_60 = local_60 + 1) {
      for (local_64 = 0; local_64 < iVar2; local_64 = local_64 + 1) {
        in_stack_ffffffffffffff78 =
             (TPZGenMatrix<int> *)
             TPZGenMatrix<int>::operator()
                       (in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        in_stack_ffffffffffffff6c = *(int *)&in_stack_ffffffffffffff78->fMem;
        in_stack_ffffffffffffff70 =
             (TPZGenMatrix<int> *)
             TPZGenMatrix<int>::operator()
                       (in_stack_ffffffffffffff78,(int64_t)in_stack_ffffffffffffff70,
                        CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *(int *)&in_stack_ffffffffffffff70->fMem = in_stack_ffffffffffffff6c;
      }
      local_28 = local_28 + 1;
    }
    TPZGenMatrix<int>::~TPZGenMatrix(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

void TPZShapeTetra::ShapeOrder(const TPZVec<int64_t> &id, const TPZVec<int> &order, TPZGenMatrix<int> &shapeorders)//, TPZVec<int64_t> &sides
    {
        //DebugStop();
        
        int64_t nsides = TPZShapeTetra::NSides;
        int nshape;
        
        int linha = 0;
        for (int side = 0; side < nsides; side++)
        {
            
            nshape = 1;
            if(side >= NCornerNodes) nshape = NConnectShapeF(side,order[side-NCornerNodes]);
            int sideorder = 1;
            if(side >= NCornerNodes) sideorder = order[side-NCornerNodes];
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            SideShapeOrder(side, id, sideorder, locshapeorders);
            
            int nlin = locshapeorders.Rows();
            int ncol = locshapeorders.Cols();
            
            for (int il = 0; il<nlin; il++)
            {
                for (int jc = 0; jc<ncol; jc++)
                {
                    shapeorders(linha, jc) = locshapeorders(il, jc);
                }
                linha++;
            }
        }

    }